

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O2

token * __thiscall lightconf::scanner::cur_token(token *__return_storage_ptr__,scanner *this)

{
  pointer ptVar1;
  token *tok;
  
  ptVar1 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ptVar1 >> 6 == (ulong)this->cur_token_
     ) {
    token::token(__return_storage_ptr__,none_token);
    __return_storage_ptr__->type = eof_token;
  }
  else {
    token::token(__return_storage_ptr__,ptVar1 + this->cur_token_);
  }
  return __return_storage_ptr__;
}

Assistant:

inline token scanner::cur_token() const {
    if (cur_token_ == tokens_.size()) {
        token tok;
        tok.type = token_type::eof_token;
        return tok;
    }
    return tokens_[cur_token_];
}